

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtype.cpp
# Opt level: O0

void __thiscall vm_val_t::ll_index(vm_val_t *this,vm_val_t *ret,vm_val_t *idx)

{
  int32_t iVar1;
  CVmObject *this_00;
  size_t sVar2;
  char *pcVar3;
  vm_val_t *in_RSI;
  int *in_RDI;
  int i;
  char *p;
  char *in_stack_00000048;
  vm_val_t *in_stack_00000050;
  vm_val_t *in_stack_ffffffffffffffb8;
  vm_val_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  this_00 = (CVmObject *)get_as_list(in_stack_ffffffffffffffb8);
  if (this_00 == (CVmObject *)0x0) {
    if (*in_RDI == 5) {
      vm_objp(0);
      CVmObject::index_val_ov
                (this_00,(vm_val_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (vm_obj_id_t)((ulong)in_RDI >> 0x20),
                 (vm_val_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    else {
      pcVar3 = get_as_string(in_stack_ffffffffffffffb8);
      if (pcVar3 == (char *)0x0) {
        set_nil(in_RSI);
      }
      else {
        vmb_get_len((char *)0x39e31a);
        CVmObjString::parse_num_val
                  (in_stack_00000050,in_stack_00000048,(size_t)this,ret._4_4_,(int)ret);
      }
    }
  }
  else {
    iVar1 = cast_to_int(in_stack_ffffffffffffffc0);
    if ((iVar1 < 1) || (sVar2 = vmb_get_len((char *)0x39e274), (int)sVar2 < iVar1)) {
      err_throw(0);
    }
    vmb_get_dh((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void vm_val_t::ll_index(VMG_ vm_val_t *ret, const vm_val_t *idx) const
{
    /* try it as a regular list first, then as an object */
    const char *p;
    if ((p = get_as_list(vmg0_)) != 0)
    {
        /* get the index as an integer value */
        int i = idx->cast_to_int(vmg0_);

        /* check the range */
        if (i < 1 || i > (int)vmb_get_len(p))
            err_throw(VMERR_INDEX_OUT_OF_RANGE);

        /* it's in range - retrieve the element */
        vmb_get_dh(p + VMB_LEN + (size_t)((i - 1) * VMB_DATAHOLDER), ret);
    }
    else if (typ == VM_OBJ)
    {
        /* use the object method, allowing operator overloading */
        vm_objp(vmg_ val.obj)->index_val_ov(vmg_ ret, val.obj, idx);
    }
    else if ((p = get_as_string(vmg0_)) != 0)
    {
        /* string - parse the string as an integer in decimal format */
        CVmObjString::parse_num_val(
            vmg_ ret, p + VMB_LEN, vmb_get_len(p), 10, TRUE);
    }
    else
    {
        /* no value */
        ret->set_nil();
    }
}